

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_get_max_channel_count(cubeb_conflict *ctx,uint32_t *max_channels)

{
  uint *in_RSI;
  long in_RDI;
  int local_4;
  
  if ((in_RDI != 0) && (in_RSI != (uint *)0x0)) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      local_4 = -1;
    }
    else {
      *in_RSI = (uint)**(byte **)(in_RDI + 0x20);
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("ctx && max_channels",
                "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                ,0x2df,"int pulse_get_max_channel_count(cubeb *, uint32_t *)");
}

Assistant:

static int
pulse_get_max_channel_count(cubeb * ctx, uint32_t * max_channels)
{
  (void)ctx;
  assert(ctx && max_channels);

  if (!ctx->default_sink_info)
    return CUBEB_ERROR;

  *max_channels = ctx->default_sink_info->channel_map.channels;

  return CUBEB_OK;
}